

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hts.c
# Opt level: O0

int hts_close(htsFile *fp)

{
  htsExactFormat hVar1;
  int iVar2;
  int *piVar3;
  BGZF *gzfp;
  int save;
  int ret;
  htsFile *fp_local;
  
  hVar1 = (fp->format).format;
  if (hVar1 != binary_format) {
    if (hVar1 - text_format < 2) {
LAB_0010cc27:
      if ((*(uint *)fp >> 1 & 1) == 0) {
        gzfp._4_4_ = bgzf_close((BGZF *)((fp->fp).cram)->header);
        ks_destroy((kstream_t *)(fp->fp).bgzf);
      }
      else if ((fp->format).compression == no_compression) {
        gzfp._4_4_ = hclose((fp->fp).hfile);
      }
      else {
        gzfp._4_4_ = bgzf_close((fp->fp).bgzf);
      }
      goto LAB_0010cc99;
    }
    if (hVar1 != bam) {
      if (hVar1 == cram) {
        if ((*(uint *)fp >> 1 & 1) == 0) {
          iVar2 = cram_eof((fp->fp).cram);
          if (iVar2 == 0) {
            fprintf(_stderr,"[E::%s] Failed to decode sequence.\n","hts_close");
            return -1;
          }
          if (iVar2 == 2) {
            fprintf(_stderr,"[W::%s] EOF marker is absent. The input is probably truncated.\n",
                    "hts_close");
          }
        }
        gzfp._4_4_ = cram_close((fp->fp).cram);
        goto LAB_0010cc99;
      }
      if (hVar1 == vcf) goto LAB_0010cc27;
      if (hVar1 != bcf) {
        gzfp._4_4_ = -1;
        goto LAB_0010cc99;
      }
    }
  }
  gzfp._4_4_ = bgzf_close((fp->fp).bgzf);
LAB_0010cc99:
  piVar3 = __errno_location();
  iVar2 = *piVar3;
  free(fp->fn);
  free(fp->fn_aux);
  free((fp->line).s);
  free(fp);
  piVar3 = __errno_location();
  *piVar3 = iVar2;
  return gzfp._4_4_;
}

Assistant:

int hts_close(htsFile *fp)
{
    int ret, save;

    switch (fp->format.format) {
    case binary_format:
    case bam:
    case bcf:
        ret = bgzf_close(fp->fp.bgzf);
        break;

    case cram:
        if (!fp->is_write) {
            switch (cram_eof(fp->fp.cram)) {
            case 0:
                fprintf(stderr, "[E::%s] Failed to decode sequence.\n", __func__);
                return -1;
            case 2:
                fprintf(stderr, "[W::%s] EOF marker is absent. The input is probably truncated.\n", __func__);
                break;
            default: /* case 1, expected EOF */
                break;
            }
        }
        ret = cram_close(fp->fp.cram);
        break;

    case text_format:
    case sam:
    case vcf:
        if (!fp->is_write) {
        #if KS_BGZF
            BGZF *gzfp = ((kstream_t*)fp->fp.voidp)->f;
            ret = bgzf_close(gzfp);
        #else
            gzFile gzfp = ((kstream_t*)fp->fp.voidp)->f;
            ret = gzclose(gzfp);
        #endif
            ks_destroy((kstream_t*)fp->fp.voidp);
        }
        else if (fp->format.compression != no_compression)
            ret = bgzf_close(fp->fp.bgzf);
        else
            ret = hclose(fp->fp.hfile);
        break;

    default:
        ret = -1;
        break;
    }

    save = errno;
    free(fp->fn);
    free(fp->fn_aux);
    free(fp->line.s);
    free(fp);
    errno = save;
    return ret;
}